

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::printLineWidthError
          (LineRenderCase *this,IVec2 *pos,int detectedLineWidth,IVec2 *lineWidthRange,
          bool isHorizontal,int *messageLimitCounter)

{
  ostringstream *this_00;
  char *pcVar1;
  MessageBuilder local_1a8;
  
  *messageLimitCounter = *messageLimitCounter + -1;
  if (-1 < *messageLimitCounter) {
    local_1a8.m_log =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_00 = &local_1a8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Found incorrect line width near ");
    tcu::operator<<((ostream *)this_00,pos);
    std::operator<<((ostream *)this_00,": (");
    pcVar1 = "vertical";
    if (isHorizontal) {
      pcVar1 = "horizontal";
    }
    std::operator<<((ostream *)this_00,pcVar1);
    std::operator<<((ostream *)this_00," line)\n");
    std::operator<<((ostream *)this_00,"\tExpected line width in range [");
    std::ostream::operator<<(this_00,lineWidthRange->m_data[0]);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,lineWidthRange->m_data[1]);
    std::operator<<((ostream *)this_00,"] but found ");
    std::ostream::operator<<(this_00,detectedLineWidth);
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return;
}

Assistant:

void LineRenderCase::printLineWidthError (const tcu::IVec2& pos, int detectedLineWidth, const tcu::IVec2& lineWidthRange, bool isHorizontal, int& messageLimitCounter) const
{
	if (--messageLimitCounter < 0)
		return;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Found incorrect line width near " << pos << ": (" << ((isHorizontal) ? ("horizontal") : ("vertical")) << " line)\n"
			<< "\tExpected line width in range [" << lineWidthRange.x() << ", " << lineWidthRange.y() << "] but found " << detectedLineWidth
		<< tcu::TestLog::EndMessage;
}